

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  ulong value;
  byte *pbVar5;
  Value *this_00;
  ulong uVar6;
  Value local_c0;
  Value local_98;
  Value local_70;
  Value local_48;
  
  cVar1 = *token->start_;
  uVar4 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar5 = (byte *)(token->start_ + (cVar1 == '-'));
  value = 0;
  while (pbVar5 < token->end_) {
    bVar2 = *pbVar5;
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_00124820:
      bVar3 = decodeDouble(this,token,decoded);
      return bVar3;
    }
    pbVar5 = pbVar5 + 1;
    uVar6 = (ulong)(bVar2 - 0x30);
    if ((uVar4 / 10 <= value) &&
       (((uVar4 / 10 < value || (pbVar5 != (byte *)token->end_)) || (uVar4 % 10 < uVar6))))
    goto LAB_00124820;
    value = value * 10 + uVar6;
  }
  if ((cVar1 == '-') && (value == uVar4)) {
    this_00 = &local_48;
    value = 0x8000000000000000;
  }
  else if (cVar1 == '-') {
    value = -value;
    this_00 = &local_70;
  }
  else {
    if (0x7fffffff < value) {
      this_00 = &local_c0;
      Value::Value(this_00,value);
      goto LAB_00124879;
    }
    this_00 = &local_98;
  }
  Value::Value(this_00,value);
LAB_00124879:
  Value::swap(decoded,this_00);
  Value::~Value(this_00);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::maxLargestInt) + 1
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative && value == maxIntegerValue)
    decoded = Value::minLargestInt;
  else if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}